

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

void __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
~LinkedList(LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010bc68;
  while (pLVar1 = this->_header, pLVar1 != this->_tail) {
    deleteFromHeader(this);
  }
  if (pLVar1 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
    (*pLVar1->_vptr_ListNode[1])();
  }
  this->_header = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  this->_tail = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  this->_size = 0;
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }